

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleStringInternalCache_deallocatingLargeMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarningButOnlyOnce_Test
::testBody(TEST_SimpleStringInternalCache_deallocatingLargeMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarningButOnlyOnce_Test
           *this)

{
  UtestShell *pUVar1;
  SimpleString *this_00;
  size_t sVar2;
  TestTerminator *pTVar3;
  SimpleString local_20;
  TEST_SimpleStringInternalCache_deallocatingLargeMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarningButOnlyOnce_Test
  *local_10;
  TEST_SimpleStringInternalCache_deallocatingLargeMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarningButOnlyOnce_Test
  *this_local;
  
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.testFunction =
       deallocatingStringMemoryTwiceThatWasntAllocatedWithCache_;
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.allocationSize =
       0x3039;
  local_10 = this;
  SimpleStringInternalCache::setAllocator
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).cache,
             &((this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).allocator)->
              super_TestMemoryAllocator);
  TestTestingFixture::runAllTests
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).fixture);
  pUVar1 = UtestShell::getCurrent();
  this_00 = TestTestingFixture::getOutput
                      (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).fixture);
  SimpleString::SimpleString(&local_20,"WARNING");
  sVar2 = SimpleString::count(this_00,&local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,1,sVar2,"LONGS_EQUAL(1, fixture.getOutput().count(\"WARNING\")) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringCacheTest.cpp"
             ,0x143,pTVar3);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

TEST(SimpleStringInternalCache, deallocatingLargeMemoryThatWasntAllocatedWhileCacheWasInPlaceProducesWarningButOnlyOnce)
{
    testFunction.testFunction = deallocatingStringMemoryTwiceThatWasntAllocatedWithCache_;
    testFunction.allocationSize = 12345;

    cache.setAllocator(allocator);
    fixture.runAllTests();

    LONGS_EQUAL(1, fixture.getOutput().count("WARNING"));
}